

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_rank(run_container_t *container,uint16_t x)

{
  uint uVar1;
  uint uVar2;
  uint32_t endpoint;
  uint32_t length;
  uint32_t startpoint;
  int i;
  uint32_t x32;
  int sum;
  uint16_t x_local;
  run_container_t *container_local;
  
  i = 0;
  length = 0;
  while( true ) {
    if (container->n_runs <= (int)length) {
      return i;
    }
    uVar1 = (uint)container->runs[(int)length].value;
    uVar2 = (uint)container->runs[(int)length].length;
    if ((uint)x <= uVar2 + uVar1) break;
    i = uVar2 + 1 + i;
    length = length + 1;
  }
  if (x < uVar1) {
    return i;
  }
  return i + (x - uVar1) + 1;
}

Assistant:

int run_container_rank(const run_container_t *container, uint16_t x) {
    int sum = 0;
    uint32_t x32 = x;
    for (int i = 0; i < container->n_runs; i++) {
        uint32_t startpoint = container->runs[i].value;
        uint32_t length = container->runs[i].length;
        uint32_t endpoint = length + startpoint;
        if (x <= endpoint) {
            if (x < startpoint) break;
            return sum + (x32 - startpoint) + 1;
        } else {
            sum += length + 1;
        }
    }
    return sum;
}